

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1load.c
# Opt level: O2

FT_Error T1_Set_MM_Design(T1_Face face,FT_UInt num_coords,FT_Long *coords)

{
  PS_Blend pPVar1;
  long *plVar2;
  FT_Long *pFVar3;
  FT_Fixed FVar4;
  FT_Error FVar5;
  long lVar6;
  FT_Long FVar7;
  ulong uVar8;
  ulong uVar9;
  uint num_coords_00;
  ulong uVar10;
  FT_Fixed local_b8;
  FT_Fixed final_blends [16];
  
  pPVar1 = face->blend;
  if (pPVar1 == (PS_Blend)0x0) {
    FVar5 = 6;
  }
  else {
    num_coords_00 = pPVar1->num_axis;
    if (num_coords_00 < num_coords) {
      num_coords = num_coords_00;
    }
    final_blends[0xf] = (FT_Fixed)face;
    for (uVar9 = 0; FVar4 = final_blends[0xf], uVar9 < num_coords_00; uVar9 = uVar9 + 1) {
      plVar2 = pPVar1->design_map[uVar9].design_points;
      pFVar3 = pPVar1->design_map[uVar9].blend_points;
      if (uVar9 < num_coords) {
        lVar6 = coords[uVar9];
        uVar10 = (ulong)pPVar1->design_map[uVar9].num_points;
      }
      else {
        uVar10 = (ulong)pPVar1->design_map[uVar9].num_points;
        lVar6 = (plVar2[uVar10 - 1] - *plVar2) / 2;
      }
      for (uVar8 = 0; uVar10 != uVar8; uVar8 = uVar8 + 1) {
        if (lVar6 == plVar2[uVar8]) {
          FVar7 = pFVar3[uVar8];
          goto LAB_0022c0f3;
        }
        if (lVar6 < plVar2[uVar8]) {
          if ((int)(uVar8 - 1) < 0) goto LAB_0022c0f0;
          uVar10 = uVar8 - 1 & 0xffffffff;
          FVar7 = FT_MulDiv(lVar6 - plVar2[uVar10],pFVar3[uVar8] - pFVar3[uVar10],
                            plVar2[uVar8] - plVar2[uVar10]);
          num_coords_00 = pPVar1->num_axis;
          goto LAB_0022c0f3;
        }
      }
      if (uVar10 == 0) {
LAB_0022c0f0:
        FVar7 = *pFVar3;
      }
      else {
        FVar7 = pFVar3[uVar10 - 1];
      }
LAB_0022c0f3:
      final_blends[uVar9 - 1] = FVar7;
    }
    FVar5 = t1_set_mm_blend((T1_Face)final_blends[0xf],num_coords_00,&local_b8);
    if (FVar5 == 0) {
      *(ulong *)(FVar4 + 0x10) =
           (ulong)((ulong)num_coords != 0) << 0xf | *(ulong *)(FVar4 + 0x10) & 0xffffffffffff7fff;
      FVar5 = 0;
    }
  }
  return FVar5;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  T1_Set_MM_Design( T1_Face   face,
                    FT_UInt   num_coords,
                    FT_Long*  coords )
  {
    FT_Error  error;
    PS_Blend  blend = face->blend;
    FT_UInt   n, p;
    FT_Fixed  final_blends[T1_MAX_MM_DESIGNS];


    if ( !blend )
      return FT_THROW( Invalid_Argument );

    if ( num_coords > blend->num_axis )
      num_coords = blend->num_axis;

    /* compute the blend coordinates through the blend design map */

    for ( n = 0; n < blend->num_axis; n++ )
    {
      FT_Long       design;
      FT_Fixed      the_blend;
      PS_DesignMap  map     = blend->design_map + n;
      FT_Long*      designs = map->design_points;
      FT_Fixed*     blends  = map->blend_points;
      FT_Int        before  = -1, after = -1;


      /* use a default value if we don't have a coordinate */
      if ( n < num_coords )
        design = coords[n];
      else
        design = ( designs[map->num_points - 1] - designs[0] ) / 2;

      for ( p = 0; p < (FT_UInt)map->num_points; p++ )
      {
        FT_Long  p_design = designs[p];


        /* exact match? */
        if ( design == p_design )
        {
          the_blend = blends[p];
          goto Found;
        }

        if ( design < p_design )
        {
          after = (FT_Int)p;
          break;
        }

        before = (FT_Int)p;
      }

      /* now interpolate if necessary */
      if ( before < 0 )
        the_blend = blends[0];

      else if ( after < 0 )
        the_blend = blends[map->num_points - 1];

      else
        the_blend = FT_MulDiv( design         - designs[before],
                               blends [after] - blends [before],
                               designs[after] - designs[before] );

    Found:
      final_blends[n] = the_blend;
    }

    error = t1_set_mm_blend( face, blend->num_axis, final_blends );
    if ( error )
      return error;

    if ( num_coords )
      face->root.face_flags |= FT_FACE_FLAG_VARIATION;
    else
      face->root.face_flags &= ~FT_FACE_FLAG_VARIATION;

    return FT_Err_Ok;
  }